

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

int asm_count_call_slots(ASMState *as,CCallInfo *ci,IRRef *args)

{
  int local_34;
  int local_30;
  int nfpr;
  int ngpr;
  int nslots;
  uint32_t nargs;
  uint32_t i;
  IRRef *args_local;
  CCallInfo *ci_local;
  ASMState *as_local;
  
  nfpr = 0;
  local_30 = 6;
  local_34 = 8;
  for (nslots = 0; (uint)nslots < (ci->flags & 0xff); nslots = nslots + 1) {
    if ((args[(uint)nslots] == 0) ||
       (((*(byte *)((long)as->ir + (ulong)args[(uint)nslots] * 8 + 4) & 0x1f) != 0xe &&
        ((*(byte *)((long)as->ir + (ulong)args[(uint)nslots] * 8 + 4) & 0x1f) != 0xd)))) {
      if (local_30 < 1) {
        nfpr = nfpr + 2;
      }
      else {
        local_30 = local_30 + -1;
      }
    }
    else if (local_34 < 1) {
      nfpr = nfpr + 2;
    }
    else {
      local_34 = local_34 + -1;
    }
  }
  return nfpr;
}

Assistant:

static int asm_count_call_slots(ASMState *as, const CCallInfo *ci, IRRef *args)
{
  uint32_t i, nargs = CCI_XNARGS(ci);
  int nslots = 0;
#if LJ_64
  if (LJ_ABI_WIN) {
    nslots = (int)(nargs*2);  /* Only matters for more than four args. */
  } else {
    int ngpr = REGARG_NUMGPR, nfpr = REGARG_NUMFPR;
    for (i = 0; i < nargs; i++)
      if (args[i] && irt_isfp(IR(args[i])->t)) {
	if (nfpr > 0) nfpr--; else nslots += 2;
      } else {
	if (ngpr > 0) ngpr--; else nslots += 2;
      }
  }
#else
  int ngpr = 0;
  if ((ci->flags & CCI_CC_MASK) == CCI_CC_FASTCALL)
    ngpr = 2;
  else if ((ci->flags & CCI_CC_MASK) == CCI_CC_THISCALL)
    ngpr = 1;
  for (i = 0; i < nargs; i++)
    if (args[i] && irt_isfp(IR(args[i])->t)) {
      nslots += irt_isnum(IR(args[i])->t) ? 2 : 1;
    } else {
      if (ngpr > 0) ngpr--; else nslots++;
    }
#endif
  return nslots;
}